

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O1

int run_test_socket_buffer_size(void)

{
  int iVar1;
  int extraout_EAX;
  uv_tcp_t *unaff_RBX;
  uv_udp_t *loop;
  uv_udp_t *loop_00;
  uv_tcp_t *puVar2;
  sockaddr_in addr;
  int iStack_24;
  uv_loop_t *puStack_20;
  sockaddr_in sStack_18;
  
  loop_00 = (uv_udp_t *)0x1a4b5a;
  puStack_20 = (uv_loop_t *)0x1697d1;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    puStack_20 = (uv_loop_t *)0x1697de;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1697ed;
    iVar1 = uv_tcp_init((uv_loop_t *)loop_00,&tcp);
    if (iVar1 != 0) goto LAB_001698dc;
    puVar2 = &tcp;
    puStack_20 = (uv_loop_t *)0x169806;
    iVar1 = uv_tcp_bind(&tcp,(sockaddr *)&sStack_18,0);
    loop_00 = (uv_udp_t *)puVar2;
    if (iVar1 != 0) goto LAB_001698e1;
    unaff_RBX = &tcp;
    puStack_20 = (uv_loop_t *)0x16981d;
    check_buffer_size((uv_handle_t *)&tcp);
    puStack_20 = (uv_loop_t *)0x16982c;
    uv_close((uv_handle_t *)&tcp,close_cb);
    puStack_20 = (uv_loop_t *)0x169831;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x169840;
    iVar1 = uv_udp_init((uv_loop_t *)loop_00,&udp);
    if (iVar1 != 0) goto LAB_001698e6;
    loop_00 = &udp;
    puStack_20 = (uv_loop_t *)0x169859;
    iVar1 = uv_udp_bind(&udp,(sockaddr *)&sStack_18,0);
    loop = (uv_udp_t *)unaff_RBX;
    if (iVar1 != 0) goto LAB_001698eb;
    loop = &udp;
    puStack_20 = (uv_loop_t *)0x169870;
    check_buffer_size((uv_handle_t *)&udp);
    puStack_20 = (uv_loop_t *)0x16987f;
    uv_close((uv_handle_t *)&udp,close_cb);
    puStack_20 = (uv_loop_t *)0x169884;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x16988e;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001698f0;
    if (close_cb_called != 2) goto LAB_001698f5;
    puStack_20 = (uv_loop_t *)0x1698a0;
    loop = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1698b4;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_20 = (uv_loop_t *)0x1698be;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_20 = (uv_loop_t *)0x1698c3;
    loop_00 = (uv_udp_t *)uv_default_loop();
    puStack_20 = (uv_loop_t *)0x1698cb;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x1698dc;
    run_test_socket_buffer_size_cold_1();
LAB_001698dc:
    puStack_20 = (uv_loop_t *)0x1698e1;
    run_test_socket_buffer_size_cold_2();
LAB_001698e1:
    puStack_20 = (uv_loop_t *)0x1698e6;
    run_test_socket_buffer_size_cold_3();
LAB_001698e6:
    puStack_20 = (uv_loop_t *)0x1698eb;
    run_test_socket_buffer_size_cold_4();
    loop = (uv_udp_t *)unaff_RBX;
LAB_001698eb:
    puStack_20 = (uv_loop_t *)0x1698f0;
    run_test_socket_buffer_size_cold_5();
LAB_001698f0:
    puStack_20 = (uv_loop_t *)0x1698f5;
    run_test_socket_buffer_size_cold_6();
LAB_001698f5:
    puStack_20 = (uv_loop_t *)0x1698fa;
    run_test_socket_buffer_size_cold_7();
  }
  puStack_20 = (uv_loop_t *)check_buffer_size;
  run_test_socket_buffer_size_cold_8();
  iStack_24 = 0;
  puStack_20 = (uv_loop_t *)loop;
  iVar1 = uv_recv_buffer_size((uv_handle_t *)loop_00,&iStack_24);
  if (iVar1 == 0) {
    if (iStack_24 < 1) goto LAB_0016996d;
    iStack_24 = 10000;
    iVar1 = uv_recv_buffer_size((uv_handle_t *)loop_00,&iStack_24);
    if (iVar1 != 0) goto LAB_00169972;
    iStack_24 = 0;
    iVar1 = uv_recv_buffer_size((uv_handle_t *)loop_00,&iStack_24);
    if (iVar1 == 0) {
      if ((iStack_24 == 10000) || (iStack_24 == 20000)) {
        return iStack_24;
      }
      goto LAB_0016997c;
    }
  }
  else {
    check_buffer_size_cold_1();
LAB_0016996d:
    check_buffer_size_cold_2();
LAB_00169972:
    check_buffer_size_cold_3();
  }
  check_buffer_size_cold_4();
LAB_0016997c:
  check_buffer_size_cold_5();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(socket_buffer_size) {
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &tcp));
  ASSERT(0 == uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &tcp);
  uv_close((uv_handle_t*) &tcp, close_cb);

  ASSERT(0 == uv_udp_init(uv_default_loop(), &udp));
  ASSERT(0 == uv_udp_bind(&udp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &udp);
  uv_close((uv_handle_t*) &udp, close_cb);

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}